

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O1

void __thiscall Bob::PermuteData(Bob *this)

{
  int iVar1;
  iterator __position;
  pointer pvVar2;
  pointer pvVar3;
  pointer plVar4;
  Client *this_00;
  long *plVar5;
  pointer pDVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int j;
  long lVar10;
  long lVar11;
  undefined1 local_c0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_D;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  long local_80;
  vector<DataElement,_std::allocator<DataElement>_> local_78;
  undefined1 local_60 [8];
  vector<DataElement,_std::allocator<DataElement>_> Temp;
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_c0,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Pi_R_D.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Pi_R_D.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
             (allocator_type *)local_60);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_60,
             (long)(this->super_Party).n_d,(allocator_type *)&local_78);
  Client::ReceiveDataVector(&local_78,this->cli);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_78);
  if (local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<DataElement,std::allocator<DataElement>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<DataElement*,std::vector<DataElement,std::allocator<DataElement>>>>
            ((vector<DataElement,std::allocator<DataElement>> *)local_60,
             Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&Pi_R_D.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar7 = (this->super_Party).n_d;
  if (0 < (int)uVar7) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      lVar9 = 0;
      do {
        iVar1 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        *(undefined8 *)
         (*(long *)&(this->super_Party).D.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1].
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
         + lVar9) = *(undefined8 *)
                     ((long)Pi_R_D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar11].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar9);
        *(undefined8 *)
         ((long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[iVar1].val + lVar9) =
             *(undefined8 *)((long)(long *)local_60 + lVar9 + lVar10);
        plVar5 = (long *)(*(long *)&(this->super_Party).R_D.
                                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data + lVar9);
        __position._M_current =
             (((pointer)((long)local_c0 + (long)iVar1 * 0x18))->
             super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (((pointer)((long)local_c0 + (long)iVar1 * 0x18))->
            super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)((long)local_c0 + (long)iVar1 * 0x18),
                     __position,plVar5);
        }
        else {
          *__position._M_current = *plVar5;
          *(long **)((vector<long,std::allocator<long>> *)((long)local_c0 + (long)iVar1 * 0x18) + 8)
               = __position._M_current + 1;
        }
        lVar9 = lVar9 + 8;
      } while (lVar9 == 8);
      lVar11 = lVar11 + 1;
      uVar7 = (this->super_Party).n_d;
      lVar10 = lVar10 + 0x10;
    } while (lVar11 < (int)uVar7);
  }
  if (0 < (int)uVar7) {
    pvVar2 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->super_Party).U_D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    pDVar6 = Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    do {
      lVar10 = *(long *)&pvVar3[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data;
      lVar11 = *(long *)&pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data;
      plVar4 = (((pointer)((long)local_c0 + uVar8 * 0x18))->
               super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar9 = 0;
      do {
        plVar5 = (long *)(lVar11 + lVar9 * 8);
        *plVar5 = *plVar5 + *(long *)(lVar10 + lVar9 * 8);
        pDVar6->val[lVar9] = pDVar6->val[lVar9] - (plVar4[lVar9] + *(long *)(lVar10 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      uVar8 = uVar8 + 1;
      pDVar6 = pDVar6 + 1;
    } while (uVar8 != uVar7);
  }
  this_00 = this->cli;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Client::SendDataVector
            (this_00,(vector<DataElement,_std::allocator<DataElement>_> *)
                     &S.
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_Party).n_p);
  if (S.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(S.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_80 -
                    (long)S.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60,
                    (long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)local_60);
  }
  if (Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Pi_R_D.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_c0);
  return;
}

Assistant:

void Bob::PermuteData()
{
    std::vector<std::vector<long>> Pi_R_D(n_d), S(n_d);
    std::vector<DataElement> V(n_d), Temp(n_d);
    V = cli->ReceiveDataVector();    //receive Alice's masked share of D
    Temp.assign(V.begin(), V.end());
    S.assign(D.begin(), D.end());
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[Pi_D[i]][j] = S[i][j]; //Applying Pi on Bob's Share of D
            V[Pi_D[i]].val[j] = Temp[i].val[j]; //Applying Pi on Alice's masked Share of D
            Pi_R_D[Pi_D[i]].push_back(R_D[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[i][j] += U_D[i][j];   //resplitting Bob's share of D
            V[i].val[j] = V[i].val[j] - Pi_R_D[i][j] - U_D[i][j]; //resplitting Alice's share of D
        }
    }
    cli->SendDataVector(V, n_p); //sending Alice her BlindPermuted share of D
}